

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLSSetJacFn(void *arkode_mem,ARKLsJacFn jac)

{
  int iVar1;
  void **ppvVar2;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKodeMem local_28;
  ARKLsMem local_20;
  
  ppvVar2 = &local_28;
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacFn",&local_28,&local_20);
  if (iVar1 == 0) {
    if (jac == (ARKLsJacFn)0x0) {
      local_20->jacDQ = 1;
      local_20->jac = arkLsDQJac;
    }
    else {
      if (local_20->A == (SUNMatrix)0x0) {
        arkProcessError(local_28,-3,"ARKLS","arkLSSetJacFn",
                        "Jacobian routine cannot be supplied for NULL SUNMatrix");
        return -3;
      }
      local_20->jacDQ = 0;
      local_20->jac = jac;
      ppvVar2 = &local_28->user_data;
    }
    local_20->J_data = *ppvVar2;
    local_20->user_linsys = 0;
    local_20->linsys = arkLsLinSys;
    local_20->A_data = local_28;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkLSSetJacFn(void *arkode_mem, ARKLsJacFn jac)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* return with failure if jac cannot be used */
  if ((jac != NULL) && (arkls_mem->A == NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetJacFn",
                    "Jacobian routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set the Jacobian routine pointer, and update relevant flags */
  if (jac != NULL) {
    arkls_mem->jacDQ  = SUNFALSE;
    arkls_mem->jac    = jac;
    arkls_mem->J_data = ark_mem->user_data;
  } else {
    arkls_mem->jacDQ  = SUNTRUE;
    arkls_mem->jac    = arkLsDQJac;
    arkls_mem->J_data = ark_mem;
  }

  /* ensure the internal linear system function is used */
  arkls_mem->user_linsys = SUNFALSE;
  arkls_mem->linsys      = arkLsLinSys;
  arkls_mem->A_data      = ark_mem;

  return(ARKLS_SUCCESS);
}